

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithru.c
# Opt level: O0

void initialize(void)

{
  uint uVar1;
  PmDeviceInfo *pPVar2;
  int id;
  PmDeviceInfo *info;
  
  in_queue = Pm_QueueCreate(0x400,8);
  if (in_queue == (PmQueue *)0x0) {
    __assert_fail("in_queue != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                  ,0xfd,"void initialize()");
  }
  out_queue = Pm_QueueCreate(0x400,8);
  if (out_queue != (PmQueue *)0x0) {
    Pt_Start(1,process_midi,(void *)0x0);
    Pm_Initialize();
    uVar1 = Pm_GetDefaultOutputDeviceID();
    pPVar2 = Pm_GetDeviceInfo(uVar1);
    if (pPVar2 == (PmDeviceInfo *)0x0) {
      printf("Could not open default output device (%d).",(ulong)uVar1);
      exit_with_message("");
    }
    printf("Opening output device %s %s\n",pPVar2->interf,pPVar2->name);
    Pm_OpenOutput(&midi_out,uVar1,(void *)0x0,0x400,midithru_time_proc,(void *)0x0,0);
    uVar1 = Pm_GetDefaultInputDeviceID();
    pPVar2 = Pm_GetDeviceInfo(uVar1);
    if (pPVar2 == (PmDeviceInfo *)0x0) {
      printf("Could not open default input device (%d).",(ulong)uVar1);
      exit_with_message("");
    }
    printf("Opening input device %s %s\n",pPVar2->interf,pPVar2->name);
    Pm_OpenInput(&midi_in,uVar1,(void *)0x0,0,midithru_time_proc,(void *)0x0);
    Pm_SetFilter(midi_in,0x4100);
    active = 1;
    return;
  }
  __assert_fail("out_queue != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                ,0xff,"void initialize()");
}

Assistant:

void initialize()
/* set up midi processing thread and open midi streams */
{
    /* note that it is safe to call PortMidi from the main thread for
       initialization and opening devices. You should not make any
       calls to PortMidi from this thread once the midi thread begins.
       to make PortMidi calls.
     */

    /* note that this routine provides minimal error checking. If
       you use the PortMidi library compiled with PM_CHECK_ERRORS,
       then error messages will be printed and the program will exit
       if an error is encountered. Otherwise, you should add some
       error checking to this code.
     */

    const PmDeviceInfo *info;
    int id;

    /* make the message queues */
    in_queue = Pm_QueueCreate(IN_QUEUE_SIZE, sizeof(PmEvent));
    assert(in_queue != NULL);
    out_queue = Pm_QueueCreate(OUT_QUEUE_SIZE, sizeof(PmEvent));
    assert(out_queue != NULL);

    /* always start the timer before you start midi */
    Pt_Start(1, &process_midi, 0); /* start a timer with millisecond accuracy */
    /* the timer will call our function, process_midi() every millisecond */
    
    Pm_Initialize();

    id = Pm_GetDefaultOutputDeviceID();
    info = Pm_GetDeviceInfo(id);
    if (info == NULL) {
        printf("Could not open default output device (%d).", id);
        exit_with_message("");
    }
    printf("Opening output device %s %s\n", info->interf, info->name);

    /* use zero latency because we want output to be immediate */
    Pm_OpenOutput(&midi_out, 
                  id, 
                  NULL /* driver info */,
                  OUT_QUEUE_SIZE,
                  &midithru_time_proc,
                  NULL /* time info */,
                  0 /* Latency */);

    id = Pm_GetDefaultInputDeviceID();
    info = Pm_GetDeviceInfo(id);
    if (info == NULL) {
        printf("Could not open default input device (%d).", id);
        exit_with_message("");
    }
    printf("Opening input device %s %s\n", info->interf, info->name);
    Pm_OpenInput(&midi_in, 
                 id, 
                 NULL /* driver info */,
                 0 /* use default input size */,
                 &midithru_time_proc,
                 NULL /* time info */);
    /* Note: if you set a filter here, then this will filter what goes
       to the MIDI THRU port. You may not want to do this.
     */
    Pm_SetFilter(midi_in, PM_FILT_ACTIVE | PM_FILT_CLOCK);

    active = TRUE; /* enable processing in the midi thread -- yes, this
                      is a shared variable without synchronization, but
                      this simple assignment is safe */

}